

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

SPVFuncImpl __thiscall
spirv_cross::CompilerMSL::OpCodePreprocessor::get_spv_func_impl
          (OpCodePreprocessor *this,Op opcode,uint32_t *args,uint32_t length)

{
  uint32_t uVar1;
  Dim DVar2;
  bool bVar3;
  iterator iVar4;
  SPIRVariable *pSVar5;
  SPIRType *pSVar6;
  mapped_type *pmVar7;
  SPIRExtension *pSVar8;
  SPVFuncImpl SVar9;
  
  if (opcode - OpAtomicLoad < 0x10) {
LAB_001fdcf4:
    iVar4 = ::std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->image_pointers_emulated)._M_h,args + (ulong)(opcode != OpAtomicStore) * 2
                  );
    if (iVar4.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
        != (__node_type *)0x0) {
      pSVar5 = Compiler::get<spirv_cross::SPIRVariable>
                         ((Compiler *)this->compiler,
                          *(uint32_t *)
                           ((long)iVar4.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                  ._M_cur + 0xc));
      uVar1 = *(uint32_t *)&(pSVar5->super_IVariant).field_0xc;
      if (uVar1 != 0) {
        pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this->compiler,uVar1);
        SVar9 = SPVFuncImplImage2DAtomicCoords;
        DVar2 = (pSVar6->image).dim;
joined_r0x001fdd3f:
        if (DVar2 == Dim2D) {
          return SVar9;
        }
      }
    }
    goto switchD_001fddb2_caseD_1147;
  }
  switch(opcode) {
  case OpGroupNonUniformAllEqual:
switchD_001fddb2_caseD_114e:
    SVar9 = SPVFuncImplSubgroupAllEqual;
    break;
  case OpGroupNonUniformBroadcast:
switchD_001fddb2_caseD_1150:
    SVar9 = SPVFuncImplSubgroupBroadcast;
    break;
  case OpGroupNonUniformBroadcastFirst:
switchD_001fddb2_caseD_1146:
    SVar9 = SPVFuncImplSubgroupBroadcastFirst;
    break;
  case OpGroupNonUniformBallot:
switchD_001fddb2_caseD_1145:
    SVar9 = SPVFuncImplSubgroupBallot;
    break;
  case OpGroupNonUniformInverseBallot:
  case OpGroupNonUniformBallotBitExtract:
    SVar9 = SPVFuncImplSubgroupBallotBitExtract;
    break;
  case OpGroupNonUniformBallotBitCount:
    SVar9 = SPVFuncImplSubgroupBallotBitCount;
    break;
  case OpGroupNonUniformBallotFindLSB:
    SVar9 = SPVFuncImplSubgroupBallotFindLSB;
    break;
  case OpGroupNonUniformBallotFindMSB:
    SVar9 = SPVFuncImplSubgroupBallotFindMSB;
    break;
  case OpGroupNonUniformShuffle:
    SVar9 = SPVFuncImplSubgroupShuffle;
    break;
  case OpGroupNonUniformShuffleXor:
    SVar9 = SPVFuncImplSubgroupShuffleXor;
    break;
  case OpGroupNonUniformShuffleUp:
    SVar9 = SPVFuncImplSubgroupShuffleUp;
    break;
  case OpGroupNonUniformShuffleDown:
    SVar9 = SPVFuncImplSubgroupShuffleDown;
    break;
  case OpGroupNonUniformQuadBroadcast:
    SVar9 = SPVFuncImplQuadBroadcast;
    break;
  case OpGroupNonUniformQuadSwap:
    SVar9 = SPVFuncImplQuadSwap;
    break;
  default:
    switch(opcode) {
    case OpFAdd:
    case OpFSub:
      if (((this->compiler->msl_options).invariant_float_math != false) ||
         (bVar3 = Compiler::has_decoration
                            ((Compiler *)this->compiler,(ID)args[1],DecorationNoContraction), bVar3)
         ) {
        return opcode == OpFAdd ^ SPVFuncImplFSub;
      }
      break;
    case OpISub:
    case OpIMul:
    case OpUDiv:
    case OpSDiv:
    case OpFDiv:
    case OpUMod:
    case OpSRem:
    case OpSMod:
    case OpFRem:
    case OpVectorTimesScalar:
    case OpMatrixTimesScalar:
    case OpDot:
    case OpIAddCarry:
    case OpISubBorrow:
      break;
    case OpFMul:
    case OpVectorTimesMatrix:
    case OpMatrixTimesVector:
    case OpMatrixTimesMatrix:
    case OpOuterProduct:
      if ((this->compiler->msl_options).invariant_float_math != false) {
        return SPVFuncImplFMul;
      }
      bVar3 = Compiler::has_decoration
                        ((Compiler *)this->compiler,(ID)args[1],DecorationNoContraction);
      if (bVar3) {
        return SPVFuncImplFMul;
      }
      break;
    case OpFMod:
      return SPVFuncImplMod;
    case OpUMulExtended:
    case OpSMulExtended:
      return SPVFuncImplMulExtended;
    default:
      if (opcode - OpSDot < 6) {
        return SPVFuncImplReduceAdd;
      }
      switch(opcode) {
      case OpSubgroupBallotKHR:
        goto switchD_001fddb2_caseD_1145;
      case OpSubgroupFirstInvocationKHR:
        goto switchD_001fddb2_caseD_1146;
      case OpUntypedPtrAccessChainKHR:
      case OpUntypedInBoundsPtrAccessChainKHR:
      case OpUntypedArrayLengthKHR:
      case OpUntypedPrefetchKHR:
      case OpUntypedPrefetchKHR|OpUndef:
      case OpSubgroupAllKHR:
      case OpSubgroupAnyKHR:
        break;
      case OpSubgroupAllEqualKHR:
        goto switchD_001fddb2_caseD_114e;
      case OpGroupNonUniformRotateKHR:
        return (length < 6) * '\x04' + SPVFuncImplSubgroupShuffle;
      case OpSubgroupReadInvocationKHR:
        goto switchD_001fddb2_caseD_1150;
      default:
        if (opcode - OpImageRead < 2) {
LAB_001fddbb:
          pmVar7 = ::std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->result_types,args + (ulong)(opcode != OpImageWrite) * 2);
          if (((*pmVar7 != 0) &&
              (pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this->compiler,*pmVar7),
              (pSVar6->image).dim == DimBuffer)) &&
             ((this->compiler->msl_options).texture_buffer_native == false)) {
            return SPVFuncImplTexelBufferCoords;
          }
        }
        else {
          if (opcode - OpAssumeTrueKHR < 2) {
            return SPVFuncImplAssume;
          }
          if (opcode == OpExtInst) {
            pSVar8 = Compiler::get<spirv_cross::SPIRExtension>((Compiler *)this->compiler,args[2]);
            if (*(int *)&(pSVar8->super_IVariant).field_0xc == 1) {
              uVar1 = args[3];
              switch(uVar1) {
              case 0x46:
                pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this->compiler,*args);
                SVar9 = SPVFuncImplFaceForwardScalar;
                break;
              case 0x47:
                pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this->compiler,*args);
                SVar9 = SPVFuncImplReflectScalar;
                break;
              case 0x48:
                pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this->compiler,*args);
                SVar9 = SPVFuncImplRefractScalar;
                break;
              case 0x49:
                return SPVFuncImplFindILsb;
              case 0x4a:
                return SPVFuncImplFindSMsb;
              case 0x4b:
                return SPVFuncImplFindUMsb;
              default:
                if (uVar1 == 7) {
                  return SPVFuncImplSSign;
                }
                if (uVar1 == 0xb) {
                  return SPVFuncImplRadians;
                }
                if (uVar1 == 0x22) {
                  pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this->compiler,*args);
                  if (pSVar6->columns < 5) {
                    return (SPVFuncImpl)(0x1415160000 >> ((byte)(pSVar6->columns << 3) & 0x3f));
                  }
                }
                else if (uVar1 == 0xc) {
                  return SPVFuncImplDegrees;
                }
                goto switchD_001fddb2_caseD_1147;
              }
              DVar2 = pSVar6->vecsize;
              goto joined_r0x001fdd3f;
            }
          }
          else {
            if (opcode == OpTypeArray) {
              return SPVFuncImplUnsafeArray;
            }
            if (opcode == OpImageFetch) goto LAB_001fddbb;
            if (opcode == OpQuantizeToF16) {
              return SPVFuncImplQuantizeToF16;
            }
            if (opcode == OpAtomicFAddEXT) goto LAB_001fdcf4;
          }
        }
      }
    }
  case OpGroupNonUniformIAdd:
  case OpGroupNonUniformFAdd:
  case OpGroupNonUniformIMul:
  case OpGroupNonUniformFMul:
  case OpGroupNonUniformSMin:
  case OpGroupNonUniformUMin:
  case OpGroupNonUniformFMin:
  case OpGroupNonUniformSMax:
  case OpGroupNonUniformUMax:
  case OpGroupNonUniformFMax:
  case OpGroupNonUniformBitwiseAnd:
  case OpGroupNonUniformBitwiseOr:
  case OpGroupNonUniformBitwiseXor:
  case OpGroupNonUniformLogicalAnd:
  case OpGroupNonUniformLogicalOr:
  case OpGroupNonUniformLogicalXor:
switchD_001fddb2_caseD_1147:
    SVar9 = SPVFuncImplNone;
  }
  return SVar9;
}

Assistant:

CompilerMSL::SPVFuncImpl CompilerMSL::OpCodePreprocessor::get_spv_func_impl(Op opcode, const uint32_t *args, uint32_t length)
{
	switch (opcode)
	{
	case OpFMod:
		return SPVFuncImplMod;

	case OpFAdd:
	case OpFSub:
		if (compiler.msl_options.invariant_float_math ||
		    compiler.has_decoration(args[1], DecorationNoContraction))
		{
			return opcode == OpFAdd ? SPVFuncImplFAdd : SPVFuncImplFSub;
		}
		break;

	case OpFMul:
	case OpOuterProduct:
	case OpMatrixTimesVector:
	case OpVectorTimesMatrix:
	case OpMatrixTimesMatrix:
		if (compiler.msl_options.invariant_float_math ||
		    compiler.has_decoration(args[1], DecorationNoContraction))
		{
			return SPVFuncImplFMul;
		}
		break;

	case OpQuantizeToF16:
		return SPVFuncImplQuantizeToF16;

	case OpTypeArray:
	{
		// Allow Metal to use the array<T> template to make arrays a value type
		return SPVFuncImplUnsafeArray;
	}

	// Emulate texture2D atomic operations
	case OpAtomicExchange:
	case OpAtomicCompareExchange:
	case OpAtomicCompareExchangeWeak:
	case OpAtomicIIncrement:
	case OpAtomicIDecrement:
	case OpAtomicIAdd:
	case OpAtomicFAddEXT:
	case OpAtomicISub:
	case OpAtomicSMin:
	case OpAtomicUMin:
	case OpAtomicSMax:
	case OpAtomicUMax:
	case OpAtomicAnd:
	case OpAtomicOr:
	case OpAtomicXor:
	case OpAtomicLoad:
	case OpAtomicStore:
	{
		auto it = image_pointers_emulated.find(args[opcode == OpAtomicStore ? 0 : 2]);
		if (it != image_pointers_emulated.end())
		{
			uint32_t tid = compiler.get<SPIRVariable>(it->second).basetype;
			if (tid && compiler.get<SPIRType>(tid).image.dim == Dim2D)
				return SPVFuncImplImage2DAtomicCoords;
		}
		break;
	}

	case OpImageFetch:
	case OpImageRead:
	case OpImageWrite:
	{
		// Retrieve the image type, and if it's a Buffer, emit a texel coordinate function
		uint32_t tid = result_types[args[opcode == OpImageWrite ? 0 : 2]];
		if (tid && compiler.get<SPIRType>(tid).image.dim == DimBuffer && !compiler.msl_options.texture_buffer_native)
			return SPVFuncImplTexelBufferCoords;
		break;
	}

	case OpExtInst:
	{
		uint32_t extension_set = args[2];
		if (compiler.get<SPIRExtension>(extension_set).ext == SPIRExtension::GLSL)
		{
			auto op_450 = static_cast<GLSLstd450>(args[3]);
			switch (op_450)
			{
			case GLSLstd450Radians:
				return SPVFuncImplRadians;
			case GLSLstd450Degrees:
				return SPVFuncImplDegrees;
			case GLSLstd450FindILsb:
				return SPVFuncImplFindILsb;
			case GLSLstd450FindSMsb:
				return SPVFuncImplFindSMsb;
			case GLSLstd450FindUMsb:
				return SPVFuncImplFindUMsb;
			case GLSLstd450SSign:
				return SPVFuncImplSSign;
			case GLSLstd450Reflect:
			{
				auto &type = compiler.get<SPIRType>(args[0]);
				if (type.vecsize == 1)
					return SPVFuncImplReflectScalar;
				break;
			}
			case GLSLstd450Refract:
			{
				auto &type = compiler.get<SPIRType>(args[0]);
				if (type.vecsize == 1)
					return SPVFuncImplRefractScalar;
				break;
			}
			case GLSLstd450FaceForward:
			{
				auto &type = compiler.get<SPIRType>(args[0]);
				if (type.vecsize == 1)
					return SPVFuncImplFaceForwardScalar;
				break;
			}
			case GLSLstd450MatrixInverse:
			{
				auto &mat_type = compiler.get<SPIRType>(args[0]);
				switch (mat_type.columns)
				{
				case 2:
					return SPVFuncImplInverse2x2;
				case 3:
					return SPVFuncImplInverse3x3;
				case 4:
					return SPVFuncImplInverse4x4;
				default:
					break;
				}
				break;
			}
			default:
				break;
			}
		}
		break;
	}

	case OpGroupNonUniformBroadcast:
	case OpSubgroupReadInvocationKHR:
		return SPVFuncImplSubgroupBroadcast;

	case OpGroupNonUniformBroadcastFirst:
	case OpSubgroupFirstInvocationKHR:
		return SPVFuncImplSubgroupBroadcastFirst;

	case OpGroupNonUniformBallot:
	case OpSubgroupBallotKHR:
		return SPVFuncImplSubgroupBallot;

	case OpGroupNonUniformInverseBallot:
	case OpGroupNonUniformBallotBitExtract:
		return SPVFuncImplSubgroupBallotBitExtract;

	case OpGroupNonUniformBallotFindLSB:
		return SPVFuncImplSubgroupBallotFindLSB;

	case OpGroupNonUniformBallotFindMSB:
		return SPVFuncImplSubgroupBallotFindMSB;

	case OpGroupNonUniformBallotBitCount:
		return SPVFuncImplSubgroupBallotBitCount;

	case OpGroupNonUniformAllEqual:
	case OpSubgroupAllEqualKHR:
		return SPVFuncImplSubgroupAllEqual;

	case OpGroupNonUniformShuffle:
		return SPVFuncImplSubgroupShuffle;

	case OpGroupNonUniformShuffleXor:
		return SPVFuncImplSubgroupShuffleXor;

	case OpGroupNonUniformShuffleUp:
		return SPVFuncImplSubgroupShuffleUp;

	case OpGroupNonUniformShuffleDown:
		return SPVFuncImplSubgroupShuffleDown;

	case OpGroupNonUniformRotateKHR:
		// Clustered rotate is performed using shuffle.
		if (length > 5)
			return SPVFuncImplSubgroupShuffle;
		return SPVFuncImplSubgroupRotate;

	case OpGroupNonUniformQuadBroadcast:
		return SPVFuncImplQuadBroadcast;

	case OpGroupNonUniformQuadSwap:
		return SPVFuncImplQuadSwap;

	case OpSDot:
	case OpUDot:
	case OpSUDot:
	case OpSDotAccSat:
	case OpUDotAccSat:
	case OpSUDotAccSat:
		return SPVFuncImplReduceAdd;

	case OpSMulExtended:
	case OpUMulExtended:
		return SPVFuncImplMulExtended;

	case OpAssumeTrueKHR:
	case OpExpectKHR:
		return SPVFuncImplAssume;

	default:
		break;
	}
	return SPVFuncImplNone;
}